

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  DataKey *pDVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  pointer pnVar6;
  bool bVar7;
  int iVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined7 in_register_00000011;
  long lVar10;
  Item *pIVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  int idx;
  uint local_31c;
  int local_304;
  DataKey local_300;
  Item *local_2f8;
  undefined8 uStack_2f0;
  long local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  int local_248;
  undefined1 local_244;
  undefined8 local_240;
  undefined1 local_238 [8];
  DataKey DStack_230;
  uint local_228 [11];
  undefined3 uStack_1fb;
  int iStack_1f8;
  bool bStack_1f4;
  undefined8 local_1f0;
  undefined **local_148;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  iVar3 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar4 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_238._0_4_ = 0;
  local_238._4_4_ = -1;
  local_304 = iVar3;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)local_238,row);
  pIVar11 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[iVar3].idx;
  local_31c = 0;
  if (((int)CONCAT71(in_register_00000011,scale) != 0) &&
     (pSVar5 = this->lp_scaler,
     pSVar5 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0)) {
    local_31c = (*pSVar5->_vptr_SPxScaler[1])
                          (pSVar5,pIVar11,
                           &(this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar12 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    ::soplex::infinity::__tls_init();
    local_2f8 = *(Item **)(in_FS_OFFSET + -8);
    local_1f0._0_4_ = cpp_dec_float_finite;
    local_1f0._4_4_ = 0x10;
    local_238._0_4_ = 0;
    local_238._4_4_ = 0;
    DStack_230.info = 0;
    DStack_230.idx = 0;
    local_228[0] = 0;
    local_228[1] = 0;
    local_228[2] = 0;
    local_228[3] = 0;
    local_228[4] = 0;
    local_228[5] = 0;
    local_228[6] = 0;
    local_228[7] = 0;
    local_228[8] = 0;
    local_228[9] = 0;
    stack0xfffffffffffffe00 = 0;
    uStack_1fb = 0;
    iStack_1f8 = 0;
    bStack_1f4 = false;
    uStack_2f0 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_238,(double)local_2f8);
    if ((pcVar12->fpclass != cpp_dec_float_NaN) &&
       (((fpclass_type)local_1f0 != cpp_dec_float_NaN &&
        (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (pcVar12,(cpp_dec_float<100U,_int,_void> *)local_238), iVar8 < 0)))) {
      pnVar6 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)&pnVar6[iVar3].m_backend.data;
      uStack_80 = *(undefined8 *)(pnVar6[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
      local_78 = *(undefined8 *)puVar2;
      uStack_70 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
      local_68 = *(undefined8 *)puVar2;
      uStack_60 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_48 = pnVar6[iVar3].m_backend.exp;
      local_44 = pnVar6[iVar3].m_backend.neg;
      local_40._0_4_ = pnVar6[iVar3].m_backend.fpclass;
      local_40._4_4_ = pnVar6[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_238,(soplex *)&local_88,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_31c,CONCAT31((int3)((uint)local_48 >> 8),local_44));
      pnVar6 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = local_228._32_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = local_228._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_228._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
      pDVar1 = (DataKey *)(pnVar6 + iVar3);
      pDVar1->info = local_238._0_4_;
      pDVar1->idx = local_238._4_4_;
      pDVar1[1] = DStack_230;
      pnVar6[iVar3].m_backend.exp = iStack_1f8;
      pnVar6[iVar3].m_backend.neg = bStack_1f4;
      pnVar6[iVar3].m_backend.fpclass = (fpclass_type)local_1f0;
      pnVar6[iVar3].m_backend.prec_elem = local_1f0._4_4_;
    }
    pcVar12 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    ::soplex::infinity::__tls_init();
    local_1f0._0_4_ = cpp_dec_float_finite;
    local_1f0._4_4_ = 0x10;
    local_238._0_4_ = 0;
    local_238._4_4_ = 0;
    DStack_230.info = 0;
    DStack_230.idx = 0;
    local_228[0] = 0;
    local_228[1] = 0;
    local_228[2] = 0;
    local_228[3] = 0;
    local_228[4] = 0;
    local_228[5] = 0;
    local_228[6] = 0;
    local_228[7] = 0;
    local_228[8] = 0;
    local_228[9] = 0;
    stack0xfffffffffffffe00 = 0;
    uStack_1fb = 0;
    iStack_1f8 = 0;
    bStack_1f4 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_238,-(double)local_2f8);
    if (((pcVar12->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_1f0 != cpp_dec_float_NaN))
       && (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar12,(cpp_dec_float<100U,_int,_void> *)local_238), 0 < iVar8)) {
      pnVar6 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(undefined8 *)&pnVar6[iVar3].m_backend.data;
      uStack_d0 = *(undefined8 *)(pnVar6[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
      local_c8 = *(undefined8 *)puVar2;
      uStack_c0 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
      local_b8 = *(undefined8 *)puVar2;
      uStack_b0 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
      local_a8 = *(undefined8 *)puVar2;
      uStack_a0 = *(undefined8 *)(puVar2 + 2);
      local_98 = pnVar6[iVar3].m_backend.exp;
      local_94 = pnVar6[iVar3].m_backend.neg;
      local_90._0_4_ = pnVar6[iVar3].m_backend.fpclass;
      local_90._4_4_ = pnVar6[iVar3].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_238,(soplex *)&local_d8,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_31c,CONCAT31((int3)((uint)local_98 >> 8),local_94));
      pnVar6 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = local_228._32_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = local_228._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
      puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_228._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
      pDVar1 = (DataKey *)(pnVar6 + iVar3);
      pDVar1->info = local_238._0_4_;
      pDVar1->idx = local_238._4_4_;
      pDVar1[1] = DStack_230;
      pnVar6[iVar3].m_backend.exp = iStack_1f8;
      pnVar6[iVar3].m_backend.neg = bStack_1f4;
      pnVar6[iVar3].m_backend.fpclass = (fpclass_type)local_1f0;
      pnVar6[iVar3].m_backend.prec_elem = local_1f0._4_4_;
    }
    pnVar6 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128 = *(undefined8 *)&pnVar6[iVar3].m_backend.data;
    uStack_120 = *(undefined8 *)(pnVar6[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
    local_118 = *(undefined8 *)puVar2;
    uStack_110 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
    local_108 = *(undefined8 *)puVar2;
    uStack_100 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
    local_f8 = *(undefined8 *)puVar2;
    uStack_f0 = *(undefined8 *)(puVar2 + 2);
    local_e8 = pnVar6[iVar3].m_backend.exp;
    local_e4 = pnVar6[iVar3].m_backend.neg;
    local_e0._0_4_ = pnVar6[iVar3].m_backend.fpclass;
    local_e0._4_4_ = pnVar6[iVar3].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_238,(soplex *)&local_128,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_31c,CONCAT31((int3)((uint)local_e8 >> 8),local_e4));
    pnVar6 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = local_228._32_8_;
    *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = local_228._16_8_;
    *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
    puVar2 = pnVar6[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_228._0_8_;
    *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
    pDVar1 = (DataKey *)(pnVar6 + iVar3);
    pDVar1->info = local_238._0_4_;
    pDVar1->idx = local_238._4_4_;
    pDVar1[1] = DStack_230;
    pnVar6[iVar3].m_backend.exp = iStack_1f8;
    pnVar6[iVar3].m_backend.neg = bStack_1f4;
    pnVar6[iVar3].m_backend.fpclass = (fpclass_type)local_1f0;
    pnVar6[iVar3].m_backend.prec_elem = local_1f0._4_4_;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar3] = local_31c;
  }
  lVar13 = (long)(pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  if (0 < lVar13) {
    local_2f8 = pIVar11;
    do {
      pIVar11 = local_2f8;
      lVar10 = lVar13 + -1;
      pNVar9 = (local_2f8->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar3 = pNVar9[lVar13 + -1].idx;
      if (scale) {
        local_288 = *(undefined8 *)&pNVar9[lVar10].val.m_backend.data;
        uStack_280 = *(undefined8 *)(pNVar9[lVar10].val.m_backend.data._M_elems + 2);
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 4;
        local_278 = *(undefined8 *)puVar2;
        uStack_270 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 8;
        local_268 = *(undefined8 *)puVar2;
        uStack_260 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 0xc;
        local_258 = *(undefined8 *)puVar2;
        uStack_250 = *(undefined8 *)(puVar2 + 2);
        local_248 = pNVar9[lVar10].val.m_backend.exp;
        local_244 = pNVar9[lVar10].val.m_backend.neg;
        local_240._0_4_ = pNVar9[lVar10].val.m_backend.fpclass;
        local_240._4_4_ = pNVar9[lVar10].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_238,(soplex *)&local_288,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((this->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar3] + local_31c),
                   CONCAT31((int3)((uint)local_248 >> 8),local_244));
        pNVar9 = (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = local_228._32_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = local_228._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
        puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_228._0_8_;
        *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
        *(undefined1 (*) [8])&pNVar9[lVar10].val.m_backend.data = local_238;
        *(DataKey *)(pNVar9[lVar10].val.m_backend.data._M_elems + 2) = DStack_230;
        pNVar9[lVar10].val.m_backend.exp = iStack_1f8;
        pNVar9[lVar10].val.m_backend.neg = bStack_1f4;
        pNVar9[lVar10].val.m_backend.fpclass = (fpclass_type)local_1f0;
        pNVar9[lVar10].val.m_backend.prec_elem = local_1f0._4_4_;
        pNVar9 = (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
      }
      local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pNVar9[lVar10].val.m_backend.data;
      local_2d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pNVar9[lVar10].val.m_backend.data._M_elems + 2);
      puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 4;
      local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 8;
      local_2d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pNVar9[lVar10].val.m_backend.data._M_elems + 0xc;
      local_2d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_2d8.m_backend.exp = pNVar9[lVar10].val.m_backend.exp;
      local_2d8.m_backend.neg = pNVar9[lVar10].val.m_backend.neg;
      local_2d8.m_backend.fpclass = pNVar9[lVar10].val.m_backend.fpclass;
      local_2d8.m_backend.prec_elem = pNVar9[lVar10].val.m_backend.prec_elem;
      if ((this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar3) {
        local_2e0 = lVar10;
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_238,0);
        iVar8 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar8 <= iVar3) {
          iVar8 = (iVar3 - iVar8) + 1;
          do {
            local_300.info = 0;
            local_300.idx = -1;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_300,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_238);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        local_148 = &PTR__DSVectorBase_006a3d50;
        lVar10 = local_2e0;
        if (local_130 !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_130);
          lVar10 = local_2e0;
        }
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar3,1,&local_304,&local_2d8);
      bVar7 = 1 < lVar13;
      lVar13 = lVar10;
    } while (bVar7);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar4));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }